

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int xz_filter_close(archive_read_filter *self)

{
  lzma_stream *strm;
  private_data_conflict2 *state;
  archive_read_filter *self_local;
  
  strm = (lzma_stream *)self->data;
  lzma_end(strm);
  free(strm[1].next_in);
  free(strm);
  return 0;
}

Assistant:

static int
xz_filter_close(struct archive_read_filter *self)
{
	struct private_data *state;

	state = (struct private_data *)self->data;
	lzma_end(&(state->stream));
	free(state->out_block);
	free(state);
	return (ARCHIVE_OK);
}